

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

void __thiscall sznet::net::Socket::setReusePort(Socket *this,bool on)

{
  int iVar1;
  undefined7 in_register_00000031;
  SourceFile file;
  Logger local_ff8;
  undefined1 local_28 [12];
  undefined4 local_14 [2];
  int optval;
  
  local_14[0] = (undefined4)CONCAT71(in_register_00000031,on);
  iVar1 = setsockopt(this->m_sockfd,1,0xf,local_14,4);
  if (iVar1 < 0 && on) {
    Logger::SourceFile::SourceFile<97>
              ((SourceFile *)local_28,
               (char (*) [97])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Socket.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_28._0_8_;
    file.m_size = local_28._8_4_;
    Logger::Logger(&local_ff8,file,0x47,false);
    LogStream::operator<<(&local_ff8.m_impl.m_stream,"SO_REUSEPORT failed.");
    Logger::~Logger(&local_ff8);
  }
  return;
}

Assistant:

void Socket::setReusePort(bool on)
{
#ifdef SO_REUSEPORT
	int optval = on ? 1 : 0;
	int ret = ::setsockopt(m_sockfd, SOL_SOCKET, SO_REUSEPORT, &optval, static_cast<socklen_t>(sizeof optval));
	if (ret < 0 && on)
	{
		LOG_SYSERR << "SO_REUSEPORT failed.";
	}
#else
	if (on)
	{
		LOG_ERROR << "SO_REUSEPORT is not supported.";
	}
#endif
}